

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

double * __thiscall Disa::Matrix_Sparse::at(Matrix_Sparse *this,size_t *i_row,size_t *i_column)

{
  __impl *p_Var1;
  source_location *psVar2;
  ostream *poVar3;
  source_location *psVar4;
  reference pvVar5;
  string local_368;
  string local_348;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined **local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  iterator_element iter;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined **local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ulong *local_20;
  size_t *i_column_local;
  size_t *i_row_local;
  Matrix_Sparse *this_local;
  
  psVar4 = (source_location *)*i_row;
  local_20 = i_column;
  i_column_local = i_row;
  i_row_local = (size_t *)this;
  psVar2 = (source_location *)size_row(this);
  if (psVar2 <= psVar4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_48 = &PTR_s__workspace_llm4binary_github_lic_001b7ca0;
    console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,psVar2);
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    std::__cxx11::to_string(&local_f8,*i_column_local);
    std::operator+(&local_d8,"Row index ",&local_f8);
    std::operator+(&local_b8,&local_d8," not in range ");
    range_row_abi_cxx11_(&local_118,this);
    std::operator+(&local_98,&local_b8,&local_118);
    std::operator+(&local_78,&local_98,".");
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  psVar4 = (source_location *)*local_20;
  psVar2 = (source_location *)size_column(this);
  if (psVar2 <= psVar4) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_140 = &PTR_s__workspace_llm4binary_github_lic_001b7cb8;
    console_format_abi_cxx11_(&local_138,(Disa *)0x0,(Log_Level)&local_140,psVar2);
    poVar3 = std::operator<<(poVar3,(string *)&local_138);
    std::__cxx11::to_string(&local_1e0,*local_20);
    std::operator+(&local_1c0,"Column index ",&local_1e0);
    std::operator+(&local_1a0,&local_1c0," not in range ");
    range_column_abi_cxx11_((string *)&iter.matrix,this);
    std::operator+(&local_180,&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iter.matrix
                  );
    std::operator+(&local_160,&local_180,".");
    poVar3 = std::operator<<(poVar3,(string *)&local_160);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&iter.matrix);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_138);
    exit(1);
  }
  lower_bound((iterator_element *)local_220,this,i_column_local,local_20);
  p_Var1 = (__impl *)*local_20;
  psVar4 = (source_location *)
           Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_220);
  if (p_Var1 != psVar4->_M_impl) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_248 = &PTR_s__workspace_llm4binary_github_lic_001b7cd0;
    console_format_abi_cxx11_(&local_240,(Disa *)0x0,(Log_Level)&local_248,psVar4);
    poVar3 = std::operator<<(poVar3,(string *)&local_240);
    std::__cxx11::to_string(&local_328,*i_column_local);
    std::operator+(&local_308,"Row, column index ",&local_328);
    std::operator+(&local_2e8,&local_308,", ");
    std::__cxx11::to_string(&local_348,*local_20);
    std::operator+(&local_2c8,&local_2e8,&local_348);
    std::operator+(&local_2a8,&local_2c8,"not in range ");
    range_column_abi_cxx11_(&local_368,this);
    std::operator+(&local_288,&local_2a8,&local_368);
    std::operator+(&local_268,&local_288,".");
    poVar3 = std::operator<<(poVar3,(string *)&local_268);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_240);
    exit(1);
  }
  pvVar5 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator*<Disa::Matrix_Sparse,_true>
                     ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_220);
  return pvVar5;
}

Assistant:

[[nodiscard]] double& Matrix_Sparse::at(const std::size_t& i_row, const std::size_t& i_column) {
  ASSERT(i_row < size_row(), "Row index " + std::to_string(i_row) + " not in range " + range_row() + ".");
  ASSERT(i_column < size_column(),
         "Column index " + std::to_string(i_column) + " not in range " + range_column() + ".");
  auto iter = lower_bound(i_row, i_column);
  ASSERT(i_column == iter.i_column(), "Row, column index " + std::to_string(i_row) + ", " + std::to_string(i_column) +
                                      "not in range " + range_column() + ".");

  return *iter;
}